

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryTransferProfile2(Mio_Library_t *pLibDst,Mio_Library_t *pLibSrc)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  Mio_Gate_t *local_28;
  Mio_Gate_t *pGateDst;
  Mio_Gate_t *pGateSrc;
  Mio_Library_t *pLibSrc_local;
  Mio_Library_t *pLibDst_local;
  
  for (local_28 = Mio_LibraryReadGates(pLibDst); local_28 != (Mio_Gate_t *)0x0;
      local_28 = Mio_GateReadNext(local_28)) {
    Mio_GateSetProfile2(local_28,0);
  }
  pGateDst = Mio_LibraryReadGates(pLibSrc);
  do {
    if (pGateDst == (Mio_Gate_t *)0x0) {
      return;
    }
    iVar1 = Mio_GateReadProfile2(pGateDst);
    if (0 < iVar1) {
      pcVar2 = Mio_GateReadName(pGateDst);
      local_28 = Mio_LibraryReadGateByName(pLibDst,pcVar2,(char *)0x0);
      if (local_28 == (Mio_Gate_t *)0x0) {
        for (local_28 = Mio_LibraryReadGates(pLibDst);
            (local_28 != (Mio_Gate_t *)0x0 &&
            ((local_28->field_15).uTruth != (pGateDst->field_15).uTruth));
            local_28 = Mio_GateReadNext(local_28)) {
        }
        if (local_28 == (Mio_Gate_t *)0x0) {
          pcVar2 = Mio_GateReadName(pGateDst);
          pcVar3 = Mio_LibraryReadName(pLibDst);
          printf("Cannot find gate \"%s\" in library \"%s\".\n",pcVar2,pcVar3);
          goto LAB_004c04d1;
        }
      }
      iVar1 = Mio_GateReadProfile2(pGateDst);
      Mio_GateAddToProfile2(local_28,iVar1);
    }
LAB_004c04d1:
    pGateDst = Mio_GateReadNext(pGateDst);
  } while( true );
}

Assistant:

void Mio_LibraryTransferProfile2( Mio_Library_t * pLibDst, Mio_Library_t * pLibSrc )
{
    Mio_Gate_t * pGateSrc, * pGateDst;    
    Mio_LibraryForEachGate( pLibDst, pGateDst )
        Mio_GateSetProfile2( pGateDst, 0 );
    Mio_LibraryForEachGate( pLibSrc, pGateSrc )
        if ( Mio_GateReadProfile2(pGateSrc) > 0 )
        {
            // find gate by name
            pGateDst = Mio_LibraryReadGateByName( pLibDst, Mio_GateReadName(pGateSrc), NULL );
            if ( pGateDst == NULL )
            {
                // find gate by function
                Mio_LibraryForEachGate( pLibDst, pGateDst )
                    if ( pGateDst->uTruth == pGateSrc->uTruth )
                        break;
                if ( pGateDst == NULL )
                {
                    printf( "Cannot find gate \"%s\" in library \"%s\".\n", Mio_GateReadName(pGateSrc), Mio_LibraryReadName(pLibDst) );
                    continue;
                }
            }
            Mio_GateAddToProfile2( pGateDst, Mio_GateReadProfile2(pGateSrc) );
        }
}